

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O3

void __thiscall
flatbuffers::python::PythonGenerator::GenStruct
          (PythonGenerator *this,StructDef *struct_def,string *code_ptr,ImportMap *imports)

{
  pointer ppFVar1;
  pointer ppFVar2;
  
  if ((struct_def->super_Definition).generated != false) {
    return;
  }
  GenComment(&(struct_def->super_Definition).doc_comment,code_ptr,
             (CommentConfig *)(anonymous_namespace)::def_comment,"");
  BeginClass(this,struct_def,code_ptr);
  if (struct_def->fixed == false) {
    NewRootTypeFromBuffer(this,struct_def,code_ptr);
    if ((((this->super_BaseGenerator).parser_)->file_identifier_)._M_string_length != 0) {
      GenHasFileIdentifier(this,struct_def,code_ptr);
    }
  }
  else {
    GenStructSizeOf(this,struct_def,code_ptr);
  }
  InitializeExisting(this,struct_def,code_ptr);
  ppFVar1 = (struct_def->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppFVar2 = (struct_def->fields).vec.
                 super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppFVar2 != ppFVar1;
      ppFVar2 = ppFVar2 + 1) {
    if ((*ppFVar2)->deprecated == false) {
      GenStructAccessor(this,struct_def,*ppFVar2,code_ptr,imports);
      ppFVar1 = (struct_def->fields).vec.
                super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    }
  }
  if (struct_def->fixed != false) {
    GenStructBuilder(this,struct_def,code_ptr);
    return;
  }
  GenTableBuilders(this,struct_def,code_ptr);
  return;
}

Assistant:

void GenStruct(const StructDef &struct_def, std::string *code_ptr,
                 ImportMap &imports) const {
    if (struct_def.generated) return;

    GenComment(struct_def.doc_comment, code_ptr, &def_comment);
    BeginClass(struct_def, code_ptr);
    if (!struct_def.fixed) {
      // Generate a special accessor for the table that has been declared as
      // the root type.
      NewRootTypeFromBuffer(struct_def, code_ptr);
      if (parser_.file_identifier_.length()) {
        // Generate a special function to test file_identifier
        GenHasFileIdentifier(struct_def, code_ptr);
      }
    } else {
      // Generates the SizeOf method for all structs.
      GenStructSizeOf(struct_def, code_ptr);
    }
    // Generates the Init method that sets the field in a pre-existing
    // accessor object. This is to allow object reuse.
    InitializeExisting(struct_def, code_ptr);
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      auto &field = **it;
      if (field.deprecated) continue;

      GenStructAccessor(struct_def, field, code_ptr, imports);
    }

    if (struct_def.fixed) {
      // creates a struct constructor function
      GenStructBuilder(struct_def, code_ptr);
    } else {
      // Creates a set of functions that allow table construction.
      GenTableBuilders(struct_def, code_ptr);
    }
  }